

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::image_type_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  bool bVar3;
  SPIRType *pSVar4;
  CompilerError *pCVar5;
  char *__rhs;
  allocator local_1a1;
  string res;
  SPIRType sampled_type;
  
  pSVar4 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(type->image).type.id);
  paVar1 = &res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = '\0';
  res._M_dataplus._M_p = (pointer)paVar1;
  if (*(int *)&(pSVar4->super_IVariant).field_0xc - 3U < 6) {
    ::std::__cxx11::string::assign((char *)&res);
  }
  if ((*(int *)&(type->super_IVariant).field_0xc == 0x10) && ((type->image).dim == DimSubpassData))
  {
    if ((this->options).vulkan_semantics == true) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &sampled_type,&res,"subpassInput");
      __rhs = "";
      if ((type->image).ms != false) {
        __rhs = "MS";
      }
      ::std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &sampled_type,__rhs);
      ::std::__cxx11::string::~string((string *)&sampled_type);
      goto LAB_0022dabf;
    }
    bVar3 = subpass_input_is_framebuffer_fetch(this,id);
    if (bVar3) {
      pSVar4 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(type->image).type.id);
      SPIRType::SPIRType(&sampled_type,pSVar4);
      sampled_type.vecsize = 4;
      (*(this->super_Compiler)._vptr_Compiler[0x13])(__return_storage_ptr__,this,&sampled_type,0);
      SPIRType::~SPIRType(&sampled_type);
      goto LAB_0022dabf;
    }
  }
  ::std::__cxx11::string::append((char *)&res);
  switch((type->image).dim) {
  case Dim1D:
    break;
  case Dim2D:
  case DimSubpassData:
    break;
  case Dim3D:
    break;
  case DimCube:
    break;
  case DimRect:
    if ((this->options).es == true) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&sampled_type,"Rectangle textures are not supported on OpenGL ES.",
                 &local_1a1);
      CompilerError::CompilerError(pCVar5,(string *)&sampled_type);
      __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->options).version < 0x82) {
      ::std::__cxx11::string::string((string *)&sampled_type,"GL_ARB_texture_rectangle",&local_1a1);
      require_extension_internal(this,(string *)&sampled_type);
LAB_0022d9c0:
      ::std::__cxx11::string::~string((string *)&sampled_type);
    }
    break;
  case DimBuffer:
    bVar3 = (this->options).es;
    uVar2 = (this->options).version;
    if ((uVar2 < 0x140 & bVar3) == 1) {
      ::std::__cxx11::string::string((string *)&sampled_type,"GL_OES_texture_buffer",&local_1a1);
      require_extension_internal(this,(string *)&sampled_type);
      ::std::__cxx11::string::~string((string *)&sampled_type);
    }
    else if (bVar3 == false && uVar2 < 300) {
      ::std::__cxx11::string::string
                ((string *)&sampled_type,"GL_EXT_texture_buffer_object",&local_1a1);
      require_extension_internal(this,(string *)&sampled_type);
      goto LAB_0022d9c0;
    }
    break;
  default:
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&sampled_type,
               "Only 1D, 2D, 2DRect, 3D, Buffer, InputTarget and Cube textures supported.",
               &local_1a1);
    CompilerError::CompilerError(pCVar5,(string *)&sampled_type);
    __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::append((char *)&res);
  if ((type->image).ms == true) {
    ::std::__cxx11::string::append((char *)&res);
  }
  if ((type->image).arrayed == true) {
    if (((this->options).es == false) && ((this->options).version < 0x82)) {
      ::std::__cxx11::string::string((string *)&sampled_type,"GL_EXT_texture_array",&local_1a1);
      require_extension_internal(this,(string *)&sampled_type);
      ::std::__cxx11::string::~string((string *)&sampled_type);
    }
    ::std::__cxx11::string::append((char *)&res);
  }
  if ((*(int *)&(type->super_IVariant).field_0xc - 0x11U < 2) &&
     (bVar3 = Compiler::image_is_comparison(&this->super_Compiler,type,id), bVar3)) {
    ::std::__cxx11::string::append((char *)&res);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(res.field_2._M_allocated_capacity._1_7_,res.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = res.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = res._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(res.field_2._M_allocated_capacity._1_7_,res.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = res._M_string_length;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = '\0';
  res._M_dataplus._M_p = (pointer)paVar1;
LAB_0022dabf:
  ::std::__cxx11::string::~string((string *)&res);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::image_type_glsl(const SPIRType &type, uint32_t id)
{
	auto &imagetype = get<SPIRType>(type.image.type);
	string res;

	switch (imagetype.basetype)
	{
	case SPIRType::Int:
	case SPIRType::Short:
	case SPIRType::SByte:
		res = "i";
		break;
	case SPIRType::UInt:
	case SPIRType::UShort:
	case SPIRType::UByte:
		res = "u";
		break;
	default:
		break;
	}

	// For half image types, we will force mediump for the sampler, and cast to f16 after any sampling operation.
	// We cannot express a true half texture type in GLSL. Neither for short integer formats for that matter.

	if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData && options.vulkan_semantics)
		return res + "subpassInput" + (type.image.ms ? "MS" : "");
	else if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData &&
	         subpass_input_is_framebuffer_fetch(id))
	{
		SPIRType sampled_type = get<SPIRType>(type.image.type);
		sampled_type.vecsize = 4;
		return type_to_glsl(sampled_type);
	}

	// If we're emulating subpassInput with samplers, force sampler2D
	// so we don't have to specify format.
	if (type.basetype == SPIRType::Image && type.image.dim != DimSubpassData)
	{
		// Sampler buffers are always declared as samplerBuffer even though they might be separate images in the SPIR-V.
		if (type.image.dim == DimBuffer && type.image.sampled == 1)
			res += "sampler";
		else
			res += type.image.sampled == 2 ? "image" : "texture";
	}
	else
		res += "sampler";

	switch (type.image.dim)
	{
	case Dim1D:
		res += "1D";
		break;
	case Dim2D:
		res += "2D";
		break;
	case Dim3D:
		res += "3D";
		break;
	case DimCube:
		res += "Cube";
		break;
	case DimRect:
		if (options.es)
			SPIRV_CROSS_THROW("Rectangle textures are not supported on OpenGL ES.");

		if (is_legacy_desktop())
			require_extension_internal("GL_ARB_texture_rectangle");

		res += "2DRect";
		break;

	case DimBuffer:
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_texture_buffer");
		else if (!options.es && options.version < 300)
			require_extension_internal("GL_EXT_texture_buffer_object");
		res += "Buffer";
		break;

	case DimSubpassData:
		res += "2D";
		break;
	default:
		SPIRV_CROSS_THROW("Only 1D, 2D, 2DRect, 3D, Buffer, InputTarget and Cube textures supported.");
	}

	if (type.image.ms)
		res += "MS";
	if (type.image.arrayed)
	{
		if (is_legacy_desktop())
			require_extension_internal("GL_EXT_texture_array");
		res += "Array";
	}

	// "Shadow" state in GLSL only exists for samplers and combined image samplers.
	if (((type.basetype == SPIRType::SampledImage) || (type.basetype == SPIRType::Sampler)) &&
	    image_is_comparison(type, id))
	{
		res += "Shadow";
	}

	return res;
}